

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__YCbCr_to_RGB_simd(stbi_uc *out,stbi_uc *y,stbi_uc *pcb,stbi_uc *pcr,int count,int step)

{
  undefined8 uVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  undefined6 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined4 uVar7;
  undefined6 uVar8;
  undefined2 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  ushort uVar17;
  ushort uVar25;
  ushort uVar26;
  ulong uVar18;
  ulong uVar19;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int cb;
  int cr;
  int b;
  int g;
  int r;
  int y_fixed;
  __m128i o1;
  __m128i o0;
  __m128i t1;
  __m128i t0;
  __m128i gxb;
  __m128i brb;
  __m128i gw;
  __m128i bw;
  __m128i rw;
  __m128i gws;
  __m128i bws;
  __m128i gwt;
  __m128i rws;
  __m128i cr1;
  __m128i cb1;
  __m128i cb0;
  __m128i cr0;
  __m128i yws;
  __m128i cbw;
  __m128i crw;
  __m128i yw;
  __m128i cb_biased;
  __m128i cr_biased;
  __m128i cb_bytes;
  __m128i cr_bytes;
  __m128i y_bytes;
  __m128i xw;
  __m128i y_bias;
  __m128i cb_const1;
  __m128i cb_const0;
  __m128i cr_const1;
  __m128i cr_const0;
  __m128i signflip;
  int i;
  int step_local;
  int count_local;
  stbi_uc *pcr_local;
  stbi_uc *pcb_local;
  stbi_uc *y_local;
  stbi_uc *out_local;
  undefined2 uStack_4c6;
  undefined2 uStack_4c4;
  undefined2 uStack_4c2;
  undefined2 uStack_4ae;
  undefined2 uStack_4ac;
  undefined2 uStack_4aa;
  undefined2 uStack_49e;
  undefined2 uStack_49c;
  undefined2 uStack_49a;
  short local_498;
  short sStack_496;
  short sStack_494;
  short sStack_492;
  short sStack_490;
  short sStack_48e;
  short sStack_48c;
  short sStack_48a;
  short local_478;
  short sStack_476;
  short sStack_474;
  short sStack_472;
  short sStack_470;
  short sStack_46e;
  short sStack_46c;
  short sStack_46a;
  short local_448;
  short sStack_446;
  short sStack_444;
  short sStack_442;
  short sStack_440;
  short sStack_43e;
  short sStack_43c;
  short sStack_43a;
  short local_428;
  short sStack_426;
  short sStack_424;
  short sStack_422;
  short sStack_420;
  short sStack_41e;
  short sStack_41c;
  short sStack_41a;
  short local_3e8;
  short sStack_3e6;
  short sStack_3e4;
  short sStack_3e2;
  short sStack_3e0;
  short sStack_3de;
  short sStack_3dc;
  short sStack_3da;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  short local_3c8;
  short sStack_3c6;
  short sStack_3c4;
  short sStack_3c2;
  short sStack_3c0;
  short sStack_3be;
  short sStack_3bc;
  short sStack_3ba;
  byte local_398;
  undefined1 uStack_397;
  undefined1 uStack_396;
  undefined1 uStack_395;
  byte bStack_394;
  undefined1 uStack_393;
  undefined1 uStack_392;
  undefined1 uStack_391;
  byte local_378;
  undefined1 uStack_377;
  undefined1 uStack_376;
  undefined1 uStack_375;
  byte bStack_374;
  undefined1 uStack_373;
  undefined1 uStack_372;
  undefined1 uStack_371;
  undefined1 local_358;
  undefined1 uStack_357;
  undefined1 uStack_356;
  undefined1 uStack_355;
  undefined1 uStack_354;
  undefined1 uStack_353;
  undefined1 uStack_352;
  undefined1 uStack_351;
  ushort uStack_176;
  ushort uStack_174;
  ushort uStack_172;
  ushort uStack_16e;
  ushort uStack_16c;
  ushort uStack_16a;
  
  signflip[1]._4_4_ = 0;
  y_local = out;
  if (step == 4) {
    for (; signflip[1]._4_4_ + 7 < count; signflip[1]._4_4_ = signflip[1]._4_4_ + 8) {
      uVar1 = *(undefined8 *)(y + signflip[1]._4_4_);
      uVar18 = *(ulong *)(pcr + signflip[1]._4_4_) ^ 0x8080808080808080;
      uVar19 = *(ulong *)(pcb + signflip[1]._4_4_) ^ 0x8080808080808080;
      local_358 = (undefined1)uVar1;
      uStack_357 = (undefined1)((ulong)uVar1 >> 8);
      uStack_356 = (undefined1)((ulong)uVar1 >> 0x10);
      uStack_355 = (undefined1)((ulong)uVar1 >> 0x18);
      uStack_354 = (undefined1)((ulong)uVar1 >> 0x20);
      uStack_353 = (undefined1)((ulong)uVar1 >> 0x28);
      uStack_352 = (undefined1)((ulong)uVar1 >> 0x30);
      uStack_351 = (undefined1)((ulong)uVar1 >> 0x38);
      local_378 = (byte)uVar18;
      uStack_377 = (undefined1)(uVar18 >> 8);
      uStack_376 = (undefined1)(uVar18 >> 0x10);
      uStack_375 = (undefined1)(uVar18 >> 0x18);
      bStack_374 = (byte)(uVar18 >> 0x20);
      uStack_373 = (undefined1)(uVar18 >> 0x28);
      uStack_372 = (undefined1)(uVar18 >> 0x30);
      uStack_371 = (undefined1)(uVar18 >> 0x38);
      local_398 = (byte)uVar19;
      uStack_397 = (undefined1)(uVar19 >> 8);
      uStack_396 = (undefined1)(uVar19 >> 0x10);
      uStack_395 = (undefined1)(uVar19 >> 0x18);
      bStack_394 = (byte)(uVar19 >> 0x20);
      uStack_393 = (undefined1)(uVar19 >> 0x28);
      uStack_392 = (undefined1)(uVar19 >> 0x30);
      uStack_391 = (undefined1)(uVar19 >> 0x38);
      uVar3 = CONCAT13(uStack_357,CONCAT12(0x80,CONCAT11(local_358,0x80)));
      uVar4 = CONCAT15(uStack_356,CONCAT14(0x80,uVar3));
      uVar7 = CONCAT13(uStack_353,CONCAT12(0x80,CONCAT11(uStack_354,0x80)));
      uVar8 = CONCAT15(uStack_352,CONCAT14(0x80,uVar7));
      uVar17 = CONCAT11(local_358,0x80) >> 4;
      uVar25 = (ushort)((uint)uVar3 >> 0x14);
      uVar26 = (ushort)((uint6)uVar4 >> 0x24);
      uVar27 = (ushort)(CONCAT17(uStack_355,CONCAT16(0x80,uVar4)) >> 0x34);
      uVar28 = CONCAT11(uStack_354,0x80) >> 4;
      uVar29 = (ushort)((uint)uVar7 >> 0x14);
      uVar30 = (ushort)((uint6)uVar8 >> 0x24);
      uVar31 = (ushort)(CONCAT17(uStack_351,CONCAT16(0x80,uVar8)) >> 0x34);
      auVar20[3] = uStack_377;
      auVar20._0_3_ = (uint3)local_378 << 8;
      auVar20[4] = 0;
      auVar20[5] = uStack_376;
      auVar20[6] = 0;
      auVar20[7] = uStack_375;
      auVar20[0xb] = uStack_373;
      auVar20._8_3_ = (uint3)bStack_374 << 8;
      auVar20[0xc] = 0;
      auVar20[0xd] = uStack_372;
      auVar20[0xe] = 0;
      auVar20[0xf] = uStack_371;
      auVar12._8_8_ = 0x166f166f166f166f;
      auVar12._0_8_ = 0x166f166f166f166f;
      auVar20 = pmulhw(auVar12,auVar20);
      auVar21[3] = uStack_397;
      auVar21._0_3_ = (uint3)local_398 << 8;
      auVar21[4] = 0;
      auVar21[5] = uStack_396;
      auVar21[6] = 0;
      auVar21[7] = uStack_395;
      auVar21[0xb] = uStack_393;
      auVar21._8_3_ = (uint3)bStack_394 << 8;
      auVar21[0xc] = 0;
      auVar21[0xd] = uStack_392;
      auVar21[0xe] = 0;
      auVar21[0xf] = uStack_391;
      auVar11._8_8_ = 0xfa7efa7efa7efa7e;
      auVar11._0_8_ = 0xfa7efa7efa7efa7e;
      auVar21 = pmulhw(auVar11,auVar21);
      auVar10[3] = uStack_397;
      auVar10._0_3_ = (uint3)local_398 << 8;
      auVar10[4] = 0;
      auVar10[5] = uStack_396;
      auVar10[6] = 0;
      auVar10[7] = uStack_395;
      auVar10[0xb] = uStack_393;
      auVar10._8_3_ = (uint3)bStack_394 << 8;
      auVar10[0xc] = 0;
      auVar10[0xd] = uStack_392;
      auVar10[0xe] = 0;
      auVar10[0xf] = uStack_391;
      auVar22._8_8_ = 0x1c5a1c5a1c5a1c5a;
      auVar22._0_8_ = 0x1c5a1c5a1c5a1c5a;
      auVar22 = pmulhw(auVar10,auVar22);
      auVar24[3] = uStack_377;
      auVar24._0_3_ = (uint3)local_378 << 8;
      auVar24[4] = 0;
      auVar24[5] = uStack_376;
      auVar24[6] = 0;
      auVar24[7] = uStack_375;
      auVar24[0xb] = uStack_373;
      auVar24._8_3_ = (uint3)bStack_374 << 8;
      auVar24[0xc] = 0;
      auVar24[0xd] = uStack_372;
      auVar24[0xe] = 0;
      auVar24[0xf] = uStack_371;
      auVar23._8_8_ = 0xf493f493f493f493;
      auVar23._0_8_ = 0xf493f493f493f493;
      auVar23 = pmulhw(auVar24,auVar23);
      local_428 = auVar20._0_2_;
      sStack_426 = auVar20._2_2_;
      sStack_424 = auVar20._4_2_;
      sStack_422 = auVar20._6_2_;
      sStack_420 = auVar20._8_2_;
      sStack_41e = auVar20._10_2_;
      sStack_41c = auVar20._12_2_;
      sStack_41a = auVar20._14_2_;
      local_448 = auVar21._0_2_;
      sStack_446 = auVar21._2_2_;
      sStack_444 = auVar21._4_2_;
      sStack_442 = auVar21._6_2_;
      sStack_440 = auVar21._8_2_;
      sStack_43e = auVar21._10_2_;
      sStack_43c = auVar21._12_2_;
      sStack_43a = auVar21._14_2_;
      local_478 = auVar22._0_2_;
      sStack_476 = auVar22._2_2_;
      sStack_474 = auVar22._4_2_;
      sStack_472 = auVar22._6_2_;
      sStack_470 = auVar22._8_2_;
      sStack_46e = auVar22._10_2_;
      sStack_46c = auVar22._12_2_;
      sStack_46a = auVar22._14_2_;
      local_498 = auVar23._0_2_;
      sStack_496 = auVar23._2_2_;
      sStack_494 = auVar23._4_2_;
      sStack_492 = auVar23._6_2_;
      sStack_490 = auVar23._8_2_;
      sStack_48e = auVar23._10_2_;
      sStack_48c = auVar23._12_2_;
      sStack_48a = auVar23._14_2_;
      auVar15._2_2_ = sStack_426 + uVar25;
      auVar15._0_2_ = local_428 + uVar17;
      auVar15._4_2_ = sStack_424 + uVar26;
      auVar15._6_2_ = sStack_422 + uVar27;
      auVar15._10_2_ = sStack_41e + uVar29;
      auVar15._8_2_ = sStack_420 + uVar28;
      auVar15._12_2_ = sStack_41c + uVar30;
      auVar15._14_2_ = sStack_41a + uVar31;
      auVar23 = psraw(auVar15,ZEXT416(4));
      auVar14._2_2_ = uVar25 + sStack_476;
      auVar14._0_2_ = uVar17 + local_478;
      auVar14._4_2_ = uVar26 + sStack_474;
      auVar14._6_2_ = uVar27 + sStack_472;
      auVar14._10_2_ = uVar29 + sStack_46e;
      auVar14._8_2_ = uVar28 + sStack_470;
      auVar14._12_2_ = uVar30 + sStack_46c;
      auVar14._14_2_ = uVar31 + sStack_46a;
      auVar24 = psraw(auVar14,ZEXT416(4));
      auVar13._2_2_ = sStack_446 + uVar25 + sStack_496;
      auVar13._0_2_ = local_448 + uVar17 + local_498;
      auVar13._4_2_ = sStack_444 + uVar26 + sStack_494;
      auVar13._6_2_ = sStack_442 + uVar27 + sStack_492;
      auVar13._10_2_ = sStack_43e + uVar29 + sStack_48e;
      auVar13._8_2_ = sStack_440 + uVar28 + sStack_490;
      auVar13._12_2_ = sStack_43c + uVar30 + sStack_48c;
      auVar13._14_2_ = sStack_43a + uVar31 + sStack_48a;
      auVar22 = psraw(auVar13,ZEXT416(4));
      local_3c8 = auVar23._0_2_;
      sStack_3c6 = auVar23._2_2_;
      sStack_3c4 = auVar23._4_2_;
      sStack_3c2 = auVar23._6_2_;
      sStack_3c0 = auVar23._8_2_;
      sStack_3be = auVar23._10_2_;
      sStack_3bc = auVar23._12_2_;
      sStack_3ba = auVar23._14_2_;
      local_3d8 = auVar24._0_2_;
      sStack_3d6 = auVar24._2_2_;
      sStack_3d4 = auVar24._4_2_;
      sStack_3d2 = auVar24._6_2_;
      sStack_3d0 = auVar24._8_2_;
      sStack_3ce = auVar24._10_2_;
      sStack_3cc = auVar24._12_2_;
      sStack_3ca = auVar24._14_2_;
      local_3e8 = auVar22._0_2_;
      sStack_3e6 = auVar22._2_2_;
      sStack_3e4 = auVar22._4_2_;
      sStack_3e2 = auVar22._6_2_;
      sStack_3e0 = auVar22._8_2_;
      sStack_3de = auVar22._10_2_;
      sStack_3dc = auVar22._12_2_;
      sStack_3da = auVar22._14_2_;
      uVar6 = CONCAT11((0 < local_3e8) * (local_3e8 < 0x100) * auVar22[0] - (0xff < local_3e8),
                       (0 < local_3c8) * (local_3c8 < 0x100) * auVar23[0] - (0xff < local_3c8));
      uVar7 = CONCAT13((0 < sStack_3e6) * (sStack_3e6 < 0x100) * auVar22[2] - (0xff < sStack_3e6),
                       CONCAT12((0 < sStack_3c6) * (sStack_3c6 < 0x100) * auVar23[2] -
                                (0xff < sStack_3c6),uVar6));
      uVar8 = CONCAT15((0 < sStack_3e4) * (sStack_3e4 < 0x100) * auVar22[4] - (0xff < sStack_3e4),
                       CONCAT14((0 < sStack_3c4) * (sStack_3c4 < 0x100) * auVar23[4] -
                                (0xff < sStack_3c4),uVar7));
      uVar2 = CONCAT11(0xff,(0 < local_3d8) * (local_3d8 < 0x100) * auVar24[0] - (0xff < local_3d8))
      ;
      uVar3 = CONCAT13(0xff,CONCAT12((0 < sStack_3d6) * (sStack_3d6 < 0x100) * auVar24[2] -
                                     (0xff < sStack_3d6),uVar2));
      uVar4 = CONCAT15(0xff,CONCAT14((0 < sStack_3d4) * (sStack_3d4 < 0x100) * auVar24[4] -
                                     (0xff < sStack_3d4),uVar3));
      uStack_4c6 = (undefined2)((uint)uVar7 >> 0x10);
      uStack_4c4 = (undefined2)((uint6)uVar8 >> 0x20);
      uStack_4c2 = (undefined2)
                   (CONCAT17((0 < sStack_3e2) * (sStack_3e2 < 0x100) * auVar22[6] -
                             (0xff < sStack_3e2),
                             CONCAT16((0 < sStack_3c2) * (sStack_3c2 < 0x100) * auVar23[6] -
                                      (0xff < sStack_3c2),uVar8)) >> 0x30);
      out_local._2_2_ = (undefined2)((uint)uVar3 >> 0x10);
      out_local._4_2_ = (undefined2)((uint6)uVar4 >> 0x20);
      out_local._6_2_ =
           (undefined2)
           (CONCAT17(0xff,CONCAT16((0 < sStack_3d2) * (sStack_3d2 < 0x100) * auVar24[6] -
                                   (0xff < sStack_3d2),uVar4)) >> 0x30);
      uVar9 = CONCAT11((0 < sStack_3e0) * (sStack_3e0 < 0x100) * auVar22[8] - (0xff < sStack_3e0),
                       (0 < sStack_3c0) * (sStack_3c0 < 0x100) * auVar23[8] - (0xff < sStack_3c0));
      uVar7 = CONCAT13((0 < sStack_3de) * (sStack_3de < 0x100) * auVar22[10] - (0xff < sStack_3de),
                       CONCAT12((0 < sStack_3be) * (sStack_3be < 0x100) * auVar23[10] -
                                (0xff < sStack_3be),uVar9));
      uVar8 = CONCAT15((0 < sStack_3dc) * (sStack_3dc < 0x100) * auVar22[0xc] - (0xff < sStack_3dc),
                       CONCAT14((0 < sStack_3bc) * (sStack_3bc < 0x100) * auVar23[0xc] -
                                (0xff < sStack_3bc),uVar7));
      uVar5 = CONCAT11(0xff,(0 < sStack_3d0) * (sStack_3d0 < 0x100) * auVar24[8] -
                            (0xff < sStack_3d0));
      uVar3 = CONCAT13(0xff,CONCAT12((0 < sStack_3ce) * (sStack_3ce < 0x100) * auVar24[10] -
                                     (0xff < sStack_3ce),uVar5));
      uVar4 = CONCAT15(0xff,CONCAT14((0 < sStack_3cc) * (sStack_3cc < 0x100) * auVar24[0xc] -
                                     (0xff < sStack_3cc),uVar3));
      uStack_49e = (undefined2)((uint)uVar7 >> 0x10);
      uStack_49c = (undefined2)((uint6)uVar8 >> 0x20);
      uStack_49a = (undefined2)
                   (CONCAT17((0 < sStack_3da) * (sStack_3da < 0x100) * auVar22[0xe] -
                             (0xff < sStack_3da),
                             CONCAT16((0 < sStack_3ba) * (sStack_3ba < 0x100) * auVar23[0xe] -
                                      (0xff < sStack_3ba),uVar8)) >> 0x30);
      uStack_4ae = (undefined2)((uint)uVar3 >> 0x10);
      uStack_4ac = (undefined2)((uint6)uVar4 >> 0x20);
      uStack_4aa = (undefined2)
                   (CONCAT17(0xff,CONCAT16((0 < sStack_3ca) * (sStack_3ca < 0x100) * auVar24[0xe] -
                                           (0xff < sStack_3ca),uVar4)) >> 0x30);
      *(ulong *)y_local = CONCAT26(out_local._2_2_,CONCAT24(uStack_4c6,CONCAT22(uVar2,uVar6)));
      *(ulong *)(y_local + 8) =
           CONCAT26(out_local._6_2_,CONCAT24(uStack_4c2,CONCAT22(out_local._4_2_,uStack_4c4)));
      *(ulong *)(y_local + 0x10) = CONCAT26(uStack_4ae,CONCAT24(uStack_49e,CONCAT22(uVar5,uVar9)));
      *(ulong *)(y_local + 0x18) =
           CONCAT26(uStack_4aa,CONCAT24(uStack_49a,CONCAT22(uStack_4ac,uStack_49c)));
      y_local = y_local + 0x20;
    }
  }
  for (; signflip[1]._4_4_ < count; signflip[1]._4_4_ = signflip[1]._4_4_ + 1) {
    iVar16 = (uint)y[signflip[1]._4_4_] * 0x100000 + 0x80000;
    b = (int)(iVar16 + (pcr[signflip[1]._4_4_] - 0x80) * 0x166f00) >> 0x14;
    cr = (int)(iVar16 + (pcr[signflip[1]._4_4_] - 0x80) * -0xb6d00 +
              ((pcb[signflip[1]._4_4_] - 0x80) * -0x58200 & 0xffff0000)) >> 0x14;
    cb = (int)(iVar16 + (pcb[signflip[1]._4_4_] - 0x80) * 0x1c5a00) >> 0x14;
    if (0xff < (uint)b) {
      if (b < 0) {
        b = 0;
      }
      else {
        b = 0xff;
      }
    }
    if (0xff < (uint)cr) {
      if (cr < 0) {
        cr = 0;
      }
      else {
        cr = 0xff;
      }
    }
    if (0xff < (uint)cb) {
      if (cb < 0) {
        cb = 0;
      }
      else {
        cb = 0xff;
      }
    }
    *y_local = (stbi_uc)b;
    y_local[1] = (stbi_uc)cr;
    y_local[2] = (stbi_uc)cb;
    y_local[3] = 0xff;
    y_local = y_local + step;
  }
  return;
}

Assistant:

static void stbi__YCbCr_to_RGB_simd(stbi_uc *out, stbi_uc const *y, stbi_uc const *pcb, stbi_uc const *pcr, int count, int step) {
  int i = 0;

#ifdef STBI_SSE2
  // step == 3 is pretty ugly on the final interleave, and i'm not convinced
  // it's useful in practice (you wouldn't use it for textures, for example).
  // so just accelerate step == 4 case.
  if (step == 4) {
    // this is a fairly straightforward implementation and not super-optimized.
    __m128i signflip = _mm_set1_epi8(-0x80);
    __m128i cr_const0 = _mm_set1_epi16((short)(1.40200f * 4096.0f + 0.5f));
    __m128i cr_const1 = _mm_set1_epi16(-(short)(0.71414f * 4096.0f + 0.5f));
    __m128i cb_const0 = _mm_set1_epi16(-(short)(0.34414f * 4096.0f + 0.5f));
    __m128i cb_const1 = _mm_set1_epi16((short)(1.77200f * 4096.0f + 0.5f));
    __m128i y_bias = _mm_set1_epi8((char)(unsigned char)128);
    __m128i xw = _mm_set1_epi16(255); // alpha channel

    for (; i + 7 < count; i += 8) {
      // load
      __m128i y_bytes = _mm_loadl_epi64((__m128i *)(y + i));
      __m128i cr_bytes = _mm_loadl_epi64((__m128i *)(pcr + i));
      __m128i cb_bytes = _mm_loadl_epi64((__m128i *)(pcb + i));
      __m128i cr_biased = _mm_xor_si128(cr_bytes, signflip); // -128
      __m128i cb_biased = _mm_xor_si128(cb_bytes, signflip); // -128

      // unpack to short (and left-shift cr, cb by 8)
      __m128i yw = _mm_unpacklo_epi8(y_bias, y_bytes);
      __m128i crw = _mm_unpacklo_epi8(_mm_setzero_si128(), cr_biased);
      __m128i cbw = _mm_unpacklo_epi8(_mm_setzero_si128(), cb_biased);

      // color transform
      __m128i yws = _mm_srli_epi16(yw, 4);
      __m128i cr0 = _mm_mulhi_epi16(cr_const0, crw);
      __m128i cb0 = _mm_mulhi_epi16(cb_const0, cbw);
      __m128i cb1 = _mm_mulhi_epi16(cbw, cb_const1);
      __m128i cr1 = _mm_mulhi_epi16(crw, cr_const1);
      __m128i rws = _mm_add_epi16(cr0, yws);
      __m128i gwt = _mm_add_epi16(cb0, yws);
      __m128i bws = _mm_add_epi16(yws, cb1);
      __m128i gws = _mm_add_epi16(gwt, cr1);

      // descale
      __m128i rw = _mm_srai_epi16(rws, 4);
      __m128i bw = _mm_srai_epi16(bws, 4);
      __m128i gw = _mm_srai_epi16(gws, 4);

      // back to byte, set up for transpose
      __m128i brb = _mm_packus_epi16(rw, bw);
      __m128i gxb = _mm_packus_epi16(gw, xw);

      // transpose to interleave channels
      __m128i t0 = _mm_unpacklo_epi8(brb, gxb);
      __m128i t1 = _mm_unpackhi_epi8(brb, gxb);
      __m128i o0 = _mm_unpacklo_epi16(t0, t1);
      __m128i o1 = _mm_unpackhi_epi16(t0, t1);

      // store
      _mm_storeu_si128((__m128i *)(out + 0), o0);
      _mm_storeu_si128((__m128i *)(out + 16), o1);
      out += 32;
    }
  }
#endif

#ifdef STBI_NEON
  // in this version, step=3 support would be easy to add. but is there demand?
  if (step == 4) {
    // this is a fairly straightforward implementation and not super-optimized.
    uint8x8_t signflip = vdup_n_u8(0x80);
    int16x8_t cr_const0 = vdupq_n_s16((short)(1.40200f * 4096.0f + 0.5f));
    int16x8_t cr_const1 = vdupq_n_s16(-(short)(0.71414f * 4096.0f + 0.5f));
    int16x8_t cb_const0 = vdupq_n_s16(-(short)(0.34414f * 4096.0f + 0.5f));
    int16x8_t cb_const1 = vdupq_n_s16((short)(1.77200f * 4096.0f + 0.5f));

    for (; i + 7 < count; i += 8) {
      // load
      uint8x8_t y_bytes = vld1_u8(y + i);
      uint8x8_t cr_bytes = vld1_u8(pcr + i);
      uint8x8_t cb_bytes = vld1_u8(pcb + i);
      int8x8_t cr_biased = vreinterpret_s8_u8(vsub_u8(cr_bytes, signflip));
      int8x8_t cb_biased = vreinterpret_s8_u8(vsub_u8(cb_bytes, signflip));

      // expand to s16
      int16x8_t yws = vreinterpretq_s16_u16(vshll_n_u8(y_bytes, 4));
      int16x8_t crw = vshll_n_s8(cr_biased, 7);
      int16x8_t cbw = vshll_n_s8(cb_biased, 7);

      // color transform
      int16x8_t cr0 = vqdmulhq_s16(crw, cr_const0);
      int16x8_t cb0 = vqdmulhq_s16(cbw, cb_const0);
      int16x8_t cr1 = vqdmulhq_s16(crw, cr_const1);
      int16x8_t cb1 = vqdmulhq_s16(cbw, cb_const1);
      int16x8_t rws = vaddq_s16(yws, cr0);
      int16x8_t gws = vaddq_s16(vaddq_s16(yws, cb0), cr1);
      int16x8_t bws = vaddq_s16(yws, cb1);

      // undo scaling, round, convert to byte
      uint8x8x4_t o;
      o.val[0] = vqrshrun_n_s16(rws, 4);
      o.val[1] = vqrshrun_n_s16(gws, 4);
      o.val[2] = vqrshrun_n_s16(bws, 4);
      o.val[3] = vdup_n_u8(255);

      // store, interleaving r/g/b/a
      vst4_u8(out, o);
      out += 8 * 4;
    }
  }
#endif

  for (; i < count; ++i) {
    int y_fixed = (y[i] << 20) + (1 << 19); // rounding
    int r, g, b;
    int cr = pcr[i] - 128;
    int cb = pcb[i] - 128;
    r = y_fixed + cr * stbi__float2fixed(1.40200f);
    g = y_fixed + cr * -stbi__float2fixed(0.71414f) + ((cb * -stbi__float2fixed(0.34414f)) & 0xffff0000);
    b = y_fixed + cb * stbi__float2fixed(1.77200f);
    r >>= 20;
    g >>= 20;
    b >>= 20;
    if ((unsigned)r > 255) {
      if (r < 0)
        r = 0;
      else
        r = 255;
    }
    if ((unsigned)g > 255) {
      if (g < 0)
        g = 0;
      else
        g = 255;
    }
    if ((unsigned)b > 255) {
      if (b < 0)
        b = 0;
      else
        b = 255;
    }
    out[0] = (stbi_uc)r;
    out[1] = (stbi_uc)g;
    out[2] = (stbi_uc)b;
    out[3] = 255;
    out += step;
  }
}